

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ReduceHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  uint uVar1;
  RecyclableObject *pRVar2;
  ThreadContext *this;
  code *pcVar3;
  double value;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  Var pvVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var10;
  uint64 uVar11;
  uint64 uVar12;
  char16_t *pcVar13;
  uint start;
  ulong uVar14;
  ulong uVar15;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var local_48;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9b26a:
    pcVar13 = L"[TypedArray].prototype.reduce";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      pcVar13 = L"Array.prototype.reduce";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,pcVar13);
  }
  pvVar8 = Arguments::operator[](args,1);
  bVar4 = JavascriptConversion::IsCallable(pvVar8);
  if (!bVar4) goto LAB_00b9b26a;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar4) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
  }
  pvVar8 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar8);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    if (length == 0) {
      pcVar13 = L"TypedArray.prototype.reduce";
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        pcVar13 = L"Array.prototype.reduce";
      }
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea0b,pcVar13);
    }
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      start = 1;
      do {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar6 = JavascriptOperators::HasItem(obj,start - 1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (BVar6 != 0) {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_48 = JavascriptOperators::GetItem(obj,start - 1,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          goto LAB_00b9afaa;
        }
        bVar4 = start < length;
        start = start + 1;
      } while (bVar4);
      pcVar13 = L"Array.prototype.reduce";
LAB_00b9af64:
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea0b,pcVar13);
    }
    bVar4 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar4) {
      bVar4 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (bVar4) {
LAB_00b9b2d2:
        Throw::FatalInternalError(-0x7fffbffb);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x277b,"(VarIsCorrectType(typedArrayBase))",
                                  "VarIsCorrectType(typedArrayBase)");
      if (bVar4) {
        *puVar9 = 0;
        goto LAB_00b9b2d2;
      }
      goto LAB_00b9b392;
    }
    if ((typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length == 0) {
      pcVar13 = L"TypedArray.prototype.reduce";
      goto LAB_00b9af64;
    }
    iVar7 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,0);
    local_48 = (Var)CONCAT44(extraout_var,iVar7);
    start = 1;
  }
  else {
    local_48 = Arguments::operator[](args,2);
    start = 0;
  }
LAB_00b9afaa:
  if (local_48 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27a2,"(accumulator)","accumulator");
    if (!bVar4) goto LAB_00b9b392;
    *puVar9 = 0;
  }
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_48 = ReduceObjectHelper<unsigned_int>
                         (obj,length,start,(RecyclableObject *)jsReentLock._24_8_,local_48,
                          scriptContext);
  }
  else {
    pRVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    bVar4 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar4) {
      bVar4 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x27a8,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar4) {
LAB_00b9b392:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    uVar1 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar1 < length) {
      length = uVar1;
    }
    if (start < length) {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar15 = (ulong)start;
      do {
        iVar7 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,uVar15 & 0xffffffff);
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        this = scriptContext->threadContext;
        bVar4 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var10);
        p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        if ((int)uVar15 < 0) {
          value = (double)(uVar15 & 0xffffffff);
          uVar11 = NumberUtilities::ToSpecial(value);
          bVar5 = NumberUtilities::IsNan(value);
          if (((bVar5) && (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0xfff8000000000000)
              ) && (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00b9b392;
            *puVar9 = 0;
          }
          uVar14 = uVar11 ^ 0xfffc000000000000;
        }
        else {
          uVar14 = uVar15 + 0x1000000000000;
        }
        local_48 = (*p_Var10)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                              0x2000005,0,0,0,0,0x2000005,pRVar2,local_48,
                              CONCAT44(extraout_var_00,iVar7),uVar14,typedArrayBase);
        this->reentrancySafeOrHandled = bVar4;
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        uVar15 = uVar15 + 1;
      } while (length != uVar15);
    }
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_48;
}

Assistant:

Var JavascriptArray::ReduceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduce"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduce"));
            }
        }

        // If we came from Array.prototype.reduce and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        T k = 0;
        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }

            bool bPresent = false;

            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    element = typedArrayBase->DirectGetItem((uint32)k);

                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, k, scriptContext));
                        bPresent = true;
                    }
                }
            }

            if (bPresent == false)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }
        }

        Assert(accumulator);

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem((uint32)k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }